

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O0

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_max_op<double,double,0>,Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>>,3,0>
       ::run<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                 (redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *eval,scalar_max_op<double,_double,_0> *func,
                 Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *xpr)

{
  Index IVar1;
  Index index_00;
  long lVar2;
  long index_01;
  CoeffReturnType pdVar3;
  double adVar4 [2];
  long local_e0;
  Index index_3;
  Index index_2;
  Index index_1;
  double local_b8 [2];
  double local_a8 [3];
  long local_90;
  Index index;
  PacketScalar packet_res1;
  PacketScalar packet_res0;
  Scalar res;
  Index alignedEnd;
  Index alignedEnd2;
  Index alignedSize;
  Index alignedSize2;
  Index alignedStart;
  int packetAlignment;
  Index packetSize;
  Index size;
  Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false> *xpr_local;
  scalar_max_op<double,_double,_0> *func_local;
  redux_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *eval_local;
  
  IVar1 = EigenBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>_>::size
                    ((EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                      *)xpr);
  index_00 = first_default_aligned<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
                       ((DenseBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                         *)xpr);
  lVar2 = ((IVar1 - index_00) / 2) * 2;
  index_01 = index_00 + ((IVar1 - index_00) / 4) * 4;
  index_3 = index_00 + lVar2;
  if (lVar2 == 0) {
    pdVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
             ::coeff((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                      *)eval,0);
    packet_res0[1] = *pdVar3;
    for (local_e0 = 1; local_e0 < IVar1; local_e0 = local_e0 + 1) {
      pdVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
               ::coeff((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)eval,local_e0);
      packet_res0[1] = scalar_max_op<double,_double,_0>::operator()(func,packet_res0 + 1,pdVar3);
    }
  }
  else {
    adVar4 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::Matrix<double,-1,1,0,-1,1>>
             ::packet<0,double__vector(2)>
                       ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                         *)eval,index_00);
    packet_res1[1] = adVar4[0];
    if (2 < lVar2) {
      adVar4 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::Matrix<double,-1,1,0,-1,1>>
               ::packet<0,double__vector(2)>
                         ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                           *)eval,index_00 + 2);
      index = adVar4[0];
      local_90 = index_00;
      while (local_90 = local_90 + 4, local_90 < index_01) {
        adVar4 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,local_90);
        local_a8[0] = adVar4[0];
        adVar4 = scalar_max_op<double,double,0>::packetOp<double__vector(2)>
                           ((scalar_max_op<double,double,0> *)func,(double (*) [2])(packet_res1 + 1)
                            ,(double (*) [2])local_a8);
        packet_res1[1] = adVar4[0];
        adVar4 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,local_90 + 2);
        local_b8[0] = adVar4[0];
        adVar4 = scalar_max_op<double,double,0>::packetOp<double__vector(2)>
                           ((scalar_max_op<double,double,0> *)func,(double (*) [2])&index,&local_b8)
        ;
        index = adVar4[0];
      }
      adVar4 = scalar_max_op<double,double,0>::packetOp<double__vector(2)>
                         ((scalar_max_op<double,double,0> *)func,(double (*) [2])(packet_res1 + 1),
                          (double (*) [2])&index);
      packet_res1[1] = adVar4[0];
      if (index_01 < index_3) {
        adVar4 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>,Eigen::Matrix<double,-1,1,0,-1,1>>
                 ::packet<0,double__vector(2)>
                           ((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>,Eigen::Matrix<double,_1,1,0,_1,1>>
                             *)eval,index_01);
        index_1 = adVar4[0];
        adVar4 = scalar_max_op<double,double,0>::packetOp<double__vector(2)>
                           ((scalar_max_op<double,double,0> *)func,(double (*) [2])(packet_res1 + 1)
                            ,(double (*) [2])&index_1);
        packet_res1[1] = adVar4[0];
      }
    }
    packet_res0[1] =
         scalar_max_op<double,double,0>::predux<double__vector(2)>
                   ((scalar_max_op<double,double,0> *)func,(double (*) [2])(packet_res1 + 1));
    for (index_2 = 0; index_2 < index_00; index_2 = index_2 + 1) {
      pdVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
               ::coeff((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)eval,index_2);
      packet_res0[1] = scalar_max_op<double,_double,_0>::operator()(func,packet_res0 + 1,pdVar3);
    }
    for (; index_3 < IVar1; index_3 = index_3 + 1) {
      pdVar3 = mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>
               ::coeff((mapbase_evaluator<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                        *)eval,index_3);
      packet_res0[1] = scalar_max_op<double,_double,_0>::operator()(func,packet_res0 + 1,pdVar3);
    }
  }
  return packet_res0[1];
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }